

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::DockNodeUpdate(ImGuiDockNode *node)

{
  long lVar1;
  long lVar2;
  ImGuiDockNode *this;
  ImGuiWindow *pIVar3;
  ImDrawList *pIVar4;
  long lVar5;
  long lVar6;
  ImGuiIO *pIVar7;
  ImGuiContext *node_00;
  bool bVar8;
  ImU32 IVar9;
  ImGuiWindow **ppIVar10;
  ImVec2 *pIVar11;
  bool local_14a;
  bool local_149;
  ImGuiWindow *local_138;
  bool local_12a;
  bool local_129;
  ImVec2 local_120;
  ImRect local_118;
  ImRect local_108;
  ImVec2 local_f8;
  ImVec2 local_f0;
  ImVec2 local_e8;
  ImVec2 local_e0;
  ImVec2 local_d8;
  ImVec2 local_d0;
  ImVec2 local_c8;
  undefined1 local_c0 [8];
  ImRect central_hole;
  ImGuiPayload *payload;
  bool central_node_hole_register_hit_test_hole;
  bool central_node_hole;
  ImGuiDockNode *central_node;
  bool render_dockspace_bg;
  ImGuiWindowFlags local_8c;
  char local_88 [4];
  ImGuiWindowFlags window_flags;
  char window_label [20];
  ImVec2 local_68;
  ImVec2 local_60;
  ImGuiWindow *local_58;
  ImGuiWindow *ref_window_1;
  ImGuiWindow *window;
  int window_n;
  bool beginned_into_host_window;
  ImGuiWindow *host_window;
  ImGuiWindow *pIStack_30;
  ImGuiDockNodeFlags node_flags;
  ImGuiWindow *ref_window;
  ImGuiWindow *single_window;
  ImGuiContext *pIStack_18;
  bool want_to_hide_host_window;
  ImGuiContext *g;
  ImGuiDockNode *node_local;
  
  pIStack_18 = GImGui;
  g = (ImGuiContext *)node;
  if (node->LastFrameActive == GImGui->FrameCount) {
    __assert_fail("node->LastFrameActive != g.FrameCount",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                  ,0x3285,"void ImGui::DockNodeUpdate(ImGuiDockNode *)");
  }
  node->LastFrameAlive = GImGui->FrameCount;
  node->field_0xba = node->field_0xba & 0xf7;
  node->OnlyNodeWithWindows = (ImGuiDockNode *)0x0;
  node->CentralNode = (ImGuiDockNode *)0x0;
  bVar8 = ImGuiDockNode::IsRootNode(node);
  if (bVar8) {
    DockNodeUpdateForRootNode((ImGuiDockNode *)g);
  }
  lVar1._0_4_ = (g->IO).MouseDragThreshold;
  lVar1._4_4_ = (g->IO).KeyMap[0];
  if ((lVar1 != 0) && (bVar8 = ImGuiDockNode::IsNoTabBar((ImGuiDockNode *)g), bVar8)) {
    DockNodeRemoveTabBar((ImGuiDockNode *)g);
  }
  single_window._7_1_ = 0;
  if ((((*(int *)&(g->IO).LogFilename < 2) &&
       (bVar8 = ImGuiDockNode::IsFloatingNode((ImGuiDockNode *)g), bVar8)) &&
      (bVar8 = ImGuiDockNode::IsLeafNode((ImGuiDockNode *)g), bVar8)) &&
     ((((pIStack_18->IO).ConfigDockingAlwaysTabBar & 1U) == 0 &&
      ((*(int *)&(g->IO).LogFilename == 0 ||
       (ppIVar10 = ImVector<ImGuiWindow_*>::operator[]
                             ((ImVector<ImGuiWindow_*> *)&(g->IO).LogFilename,0),
       (((*ppIVar10)->WindowClass).DockingAlwaysTabBar & 1U) == 0)))))) {
    single_window._7_1_ = 1;
  }
  if ((single_window._7_1_ & 1) == 0) {
    if (((((*(ushort *)&(g->IO).FontDefault >> 9 & 1) != 0) &&
         (*(long *)((g->IO).KeyMap + 0x11) == 0)) &&
        (bVar8 = ImGuiDockNode::IsFloatingNode((ImGuiDockNode *)g), bVar8)) &&
       (bVar8 = ImGuiDockNode::IsLeafNode((ImGuiDockNode *)g), bVar8)) {
      if (*(int *)&(g->IO).LogFilename < 1) {
        __assert_fail("node->Windows.Size > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                      ,12999,"void ImGui::DockNodeUpdate(ImGuiDockNode *)");
      }
      pIStack_30 = (ImGuiWindow *)0x0;
      if ((g->IO).FontGlobalScale != 0.0) {
        pIStack_30 = DockNodeFindWindowByID((ImGuiDockNode *)g,(ImGuiID)(g->IO).FontGlobalScale);
      }
      if (pIStack_30 == (ImGuiWindow *)0x0) {
        ppIVar10 = ImVector<ImGuiWindow_*>::operator[]
                             ((ImVector<ImGuiWindow_*> *)&(g->IO).LogFilename,0);
        pIStack_30 = *ppIVar10;
      }
      if (('\0' < pIStack_30->AutoFitFramesX) || ('\0' < pIStack_30->AutoFitFramesY)) {
        (g->IO).KeyMap[0xf] = 2;
        return;
      }
    }
    host_window._4_4_ = ImGuiDockNode::GetMergedFlags((ImGuiDockNode *)g);
    _window_n = (ImGuiWindow *)0x0;
    window._7_1_ = 0;
    bVar8 = ImGuiDockNode::IsDockSpace((ImGuiDockNode *)g);
    if (bVar8) {
      if (*(long *)((g->IO).KeyMap + 0x11) == 0) {
        __assert_fail("node->HostWindow",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                      ,0x32dc,"void ImGui::DockNodeUpdate(ImGuiDockNode *)");
      }
      *(ushort *)&(g->IO).FontDefault = *(ushort *)&(g->IO).FontDefault & 0xdfff;
      *(ushort *)&(g->IO).FontDefault =
           *(ushort *)&(g->IO).FontDefault & 0xf7ff |
           (ushort)((host_window._4_4_ & 0x8000) == 0) << 0xb;
      *(ushort *)&(g->IO).FontDefault =
           *(ushort *)&(g->IO).FontDefault & 0xefff |
           (ushort)((host_window._4_4_ & 0x4000) == 0) << 0xc;
      _window_n = *(ImGuiWindow **)((g->IO).KeyMap + 0x11);
    }
    else {
      *(ushort *)&(g->IO).FontDefault = *(ushort *)&(g->IO).FontDefault & 0xdfff;
      local_129 = 0 < *(int *)&(g->IO).LogFilename && (host_window._4_4_ & 0x8000) == 0;
      *(ushort *)&(g->IO).FontDefault =
           *(ushort *)&(g->IO).FontDefault & 0xf7ff | (ushort)local_129 << 0xb;
      local_12a = 0 < *(int *)&(g->IO).LogFilename && (host_window._4_4_ & 0x4000) == 0;
      *(ushort *)&(g->IO).FontDefault =
           *(ushort *)&(g->IO).FontDefault & 0xefff | (ushort)local_12a << 0xc;
      for (window._0_4_ = 0; (int)window < *(int *)&(g->IO).LogFilename;
          window._0_4_ = (int)window + 1) {
        ppIVar10 = ImVector<ImGuiWindow_*>::operator[]
                             ((ImVector<ImGuiWindow_*> *)&(g->IO).LogFilename,(int)window);
        ref_window_1 = *ppIVar10;
        ref_window_1->field_0x492 =
             ref_window_1->field_0x492 & 0xfe | 1 < *(int *)&(g->IO).LogFilename;
        *(ushort *)&(g->IO).FontDefault =
             *(ushort *)&(g->IO).FontDefault & 0xdfff |
             (ushort)(((byte)((ushort)*(undefined2 *)&(g->IO).FontDefault >> 0xd) & 1) != 0 ||
                     (ref_window_1->HasCloseButton & 1U) != 0) << 0xd;
      }
      bVar8 = ImGuiDockNode::IsRootNode((ImGuiDockNode *)g);
      if ((bVar8) && ((*(ushort *)&(g->IO).FontDefault >> 9 & 1) != 0)) {
        if (*(int *)&(g->IO).LogFilename < 1) {
          local_138 = (ImGuiWindow *)0x0;
        }
        else {
          ppIVar10 = ImVector<ImGuiWindow_*>::operator[]
                               ((ImVector<ImGuiWindow_*> *)&(g->IO).LogFilename,0);
          local_138 = *ppIVar10;
        }
        local_58 = local_138;
        if (((short)(*(short *)&(g->IO).FontDefault << 0xd) >> 0xd == 2) &&
           (local_138 != (ImGuiWindow *)0x0)) {
          ImVec2::ImVec2(&local_60,0.0,0.0);
          SetNextWindowPos(&local_138->Pos,0,&local_60);
        }
        else if ((short)(*(short *)&(g->IO).FontDefault << 0xd) >> 0xd == 1) {
          pIVar7 = &g->IO;
          ImVec2::ImVec2(&local_68,0.0,0.0);
          SetNextWindowPos((ImVec2 *)(pIVar7->KeyMap + 1),0,&local_68);
        }
        if (((short)(*(short *)&(g->IO).FontDefault << 10) >> 0xd == 2) &&
           (local_58 != (ImGuiWindow *)0x0)) {
          SetNextWindowSize(&local_58->SizeFull,0);
        }
        else if ((short)(*(short *)&(g->IO).FontDefault << 10) >> 0xd == 1) {
          SetNextWindowSize((ImVec2 *)((g->IO).KeyMap + 3),0);
        }
        if (((short)(*(short *)&(g->IO).FontDefault << 10) >> 0xd == 2) &&
           (local_58 != (ImGuiWindow *)0x0)) {
          SetNextWindowCollapsed((bool)(local_58->Collapsed & 1),0);
        }
        if (((short)(*(short *)&(g->IO).FontDefault << 7) >> 0xd == 2) &&
           (local_58 != (ImGuiWindow *)0x0)) {
          SetNextWindowViewport(local_58->ViewportId);
        }
        SetNextWindowClass((ImGuiWindowClass *)((g->IO).KeyMap + 8));
        DockNodeGetHostWindowTitle((ImGuiDockNode *)g,local_88,0x14);
        local_8c = 0x20081139;
        ImVec2::ImVec2((ImVec2 *)((long)&central_node + 4),0.0,0.0);
        PushStyleVar(1,(ImVec2 *)((long)&central_node + 4));
        Begin(local_88,(bool *)0x0,local_8c);
        PopStyleVar(1);
        window._7_1_ = 1;
        _window_n = pIStack_18->CurrentWindow;
        *(ImGuiWindow **)((g->IO).KeyMap + 0x11) = _window_n;
        _window_n->DockNodeAsHost = (ImGuiDockNode *)g;
        (_window_n->DC).CursorPos = _window_n->Pos;
        *(ImVec2 *)((g->IO).KeyMap + 1) = _window_n->Pos;
        *(ImVec2 *)((g->IO).KeyMap + 3) = _window_n->Size;
        if ((*(byte *)(*(long *)((g->IO).KeyMap + 0x11) + 0xc5) & 1) != 0) {
          BringWindowToDisplayFront(*(ImGuiWindow **)((g->IO).KeyMap + 0x11));
        }
        *(ushort *)&(g->IO).FontDefault = *(ushort *)&(g->IO).FontDefault & 0xfe3f;
        *(ushort *)&(g->IO).FontDefault = *(ushort *)&(g->IO).FontDefault & 0xffc7;
        *(ushort *)&(g->IO).FontDefault = *(ushort *)&(g->IO).FontDefault & 0xfff8;
      }
      else if ((g->IO).DisplaySize != (ImVec2)0x0) {
        _window_n = *(ImGuiWindow **)((long)(g->IO).DisplaySize + 0x80);
        *(ImGuiWindow **)((g->IO).KeyMap + 0x11) = _window_n;
        *(ushort *)&(g->IO).FontDefault = *(ushort *)&(g->IO).FontDefault & 0xfe3f;
        *(ushort *)&(g->IO).FontDefault = *(ushort *)&(g->IO).FontDefault & 0xffc7;
        *(ushort *)&(g->IO).FontDefault = *(ushort *)&(g->IO).FontDefault & 0xfff8;
      }
      if ((((ulong)(g->IO).FontDefault & 0x10000) != 0) && (*(long *)((g->IO).KeyMap + 0x11) != 0))
      {
        DockNodeStartMouseMovingWindow((ImGuiDockNode *)g,*(ImGuiWindow **)((g->IO).KeyMap + 0x11));
      }
    }
    bVar8 = ImGuiDockNode::IsSplitNode((ImGuiDockNode *)g);
    if ((bVar8) &&
       (lVar2._0_4_ = (g->IO).MouseDragThreshold, lVar2._4_4_ = (g->IO).KeyMap[0], lVar2 != 0)) {
      __assert_fail("node->TabBar == __null",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                    ,0x3333,"void ImGui::DockNodeUpdate(ImGuiDockNode *)");
    }
    bVar8 = ImGuiDockNode::IsRootNode((ImGuiDockNode *)g);
    if ((((bVar8) && (pIStack_18->NavWindow != (ImGuiWindow *)0x0)) &&
        (pIStack_18->NavWindow->RootWindowDockStop->DockNode != (ImGuiDockNode *)0x0)) &&
       (pIStack_18->NavWindow->RootWindowDockStop->ParentWindow == _window_n)) {
      *(ImGuiID *)((long)&(g->IO).Fonts + 4) =
           pIStack_18->NavWindow->RootWindowDockStop->DockNode->ID;
    }
    bVar8 = ImGuiDockNode::IsRootNode((ImGuiDockNode *)g);
    local_149 = false;
    if ((bVar8) && (local_149 = false, _window_n != (ImGuiWindow *)0x0)) {
      local_149 = (host_window._4_4_ & 8) != 0;
    }
    central_node._3_1_ = local_149;
    if (local_149 != false) {
      ImDrawList::ChannelsSplit(_window_n->DrawList,2);
      ImDrawList::ChannelsSetCurrent(_window_n->DrawList,1);
    }
    this = *(ImGuiDockNode **)((g->IO).KeyMap + 0x15);
    bVar8 = ImGuiDockNode::IsRootNode((ImGuiDockNode *)g);
    local_14a = false;
    if (((bVar8) && (local_14a = false, _window_n != (ImGuiWindow *)0x0)) &&
       ((local_14a = false, (host_window._4_4_ & 8) != 0 &&
        (local_14a = false, this != (ImGuiDockNode *)0x0)))) {
      local_14a = ImGuiDockNode::IsEmpty(this);
    }
    payload._6_1_ = local_14a;
    if ((((local_14a != false) &&
         (central_hole.Max = (ImVec2)GetDragDropPayload(), central_hole.Max != (ImVec2)0x0)) &&
        (bVar8 = ImGuiPayload::IsDataType((ImGuiPayload *)central_hole.Max,"_IMWINDOW"), bVar8)) &&
       (bVar8 = DockNodeIsDropAllowed(_window_n,(ImGuiWindow *)**(undefined8 **)central_hole.Max),
       bVar8)) {
      payload._6_1_ = false;
    }
    if (payload._6_1_ != false) {
      bVar8 = ImGuiDockNode::IsDockSpace((ImGuiDockNode *)g);
      if (!bVar8) {
        __assert_fail("node->IsDockSpace()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                      ,0x334c,"void ImGui::DockNodeUpdate(ImGuiDockNode *)");
      }
      local_c8 = operator+(&this->Pos,&this->Size);
      ImRect::ImRect((ImRect *)local_c0,&this->Pos,&local_c8);
      ImVec2::ImVec2(&local_d0,-4.0,-4.0);
      ImRect::Expand((ImRect *)local_c0,&local_d0);
      if ((local_14a != false) &&
         (bVar8 = ImRect::IsInverted((ImRect *)local_c0), pIVar3 = _window_n, !bVar8)) {
        local_d8 = operator-(&central_hole.Min,(ImVec2 *)local_c0);
        SetWindowHitTestHole(pIVar3,(ImVec2 *)local_c0,&local_d8);
        pIVar3 = _window_n->ParentWindow;
        local_e0 = operator-(&central_hole.Min,(ImVec2 *)local_c0);
        SetWindowHitTestHole(pIVar3,(ImVec2 *)local_c0,&local_e0);
      }
    }
    bVar8 = ImGuiDockNode::IsRootNode((ImGuiDockNode *)g);
    if ((bVar8) && (_window_n != (ImGuiWindow *)0x0)) {
      local_e8 = _window_n->Pos;
      local_f0 = _window_n->Size;
      DockNodeTreeUpdatePosSize((ImGuiDockNode *)g,local_e8,local_f0,false);
      DockNodeTreeUpdateSplitter((ImGuiDockNode *)g);
    }
    if ((((_window_n != (ImGuiWindow *)0x0) &&
         (bVar8 = ImGuiDockNode::IsEmpty((ImGuiDockNode *)g), bVar8)) &&
        ((*(ushort *)&(g->IO).FontDefault >> 9 & 1) != 0)) && ((host_window._4_4_ & 8) == 0)) {
      pIVar4 = _window_n->DrawList;
      pIVar11 = (ImVec2 *)((g->IO).KeyMap + 1);
      local_f8 = operator+(pIVar11,(ImVec2 *)((g->IO).KeyMap + 3));
      IVar9 = GetColorU32(0x27,1.0);
      ImDrawList::AddRectFilled(pIVar4,pIVar11,&local_f8,IVar9,0.0,0xf);
    }
    if (((central_node._3_1_ & 1) != 0) && ((*(ushort *)&(g->IO).FontDefault >> 9 & 1) != 0)) {
      ImDrawList::ChannelsSetCurrent(_window_n->DrawList,0);
      if (local_14a == false) {
        pIVar4 = _window_n->DrawList;
        pIVar11 = (ImVec2 *)((g->IO).KeyMap + 1);
        local_120 = operator+(pIVar11,(ImVec2 *)((g->IO).KeyMap + 3));
        IVar9 = GetColorU32(2,1.0);
        ImDrawList::AddRectFilled(pIVar4,pIVar11,&local_120,IVar9,0.0,0xf);
      }
      else {
        pIVar4 = _window_n->DrawList;
        local_108 = ImGuiDockNode::Rect((ImGuiDockNode *)g);
        local_118 = ImGuiDockNode::Rect(this);
        IVar9 = GetColorU32(2,1.0);
        RenderRectFilledWithHole(pIVar4,local_108,local_118,IVar9,0.0);
      }
      ImDrawList::ChannelsMerge(_window_n->DrawList);
    }
    if ((_window_n == (ImGuiWindow *)0x0) || (*(int *)&(g->IO).LogFilename < 1)) {
      *(ushort *)&(g->IO).FontDefault = *(ushort *)&(g->IO).FontDefault & 0xbfff;
      *(undefined4 *)&(g->IO).FontAllowUserScaling = 0;
      *(ushort *)&(g->IO).FontDefault = *(ushort *)&(g->IO).FontDefault & 0xfbff;
    }
    else {
      DockNodeUpdateTabBar((ImGuiDockNode *)g,_window_n);
    }
    lVar5._0_4_ = (g->IO).MouseDragThreshold;
    lVar5._4_4_ = (g->IO).KeyMap[0];
    if ((lVar5 == 0) || (*(int *)(*(long *)&(g->IO).MouseDragThreshold + 0x18) == 0)) {
      if (0 < *(int *)&(g->IO).LogFilename) {
        ppIVar10 = ImVector<ImGuiWindow_*>::operator[]
                             ((ImVector<ImGuiWindow_*> *)&(g->IO).LogFilename,0);
        (g->IO).FontGlobalScale = (float)(*ppIVar10)->ID;
      }
    }
    else {
      (g->IO).FontGlobalScale = *(float *)(*(long *)&(g->IO).MouseDragThreshold + 0x18);
    }
    if ((((_window_n != (ImGuiWindow *)0x0) && ((*(ushort *)&(g->IO).FontDefault >> 9 & 1) != 0)) &&
        (bVar8 = ImGuiDockNode::IsRootNode((ImGuiDockNode *)g), bVar8)) &&
       ((pIStack_18->MovingWindow == (ImGuiWindow *)0x0 ||
        (pIStack_18->MovingWindow->RootWindow != _window_n)))) {
      BeginDockableDragDropTarget(_window_n);
    }
    *(int *)((long)&(g->IO).UserData + 4) = pIStack_18->FrameCount;
    if (_window_n != (ImGuiWindow *)0x0) {
      lVar6._0_4_ = (g->IO).DeltaTime;
      lVar6._4_4_ = (g->IO).IniSavingRate;
      if (lVar6 != 0) {
        DockNodeUpdate(*(ImGuiDockNode **)&(g->IO).DeltaTime);
      }
      if ((g->IO).IniFilename != (char *)0x0) {
        DockNodeUpdate((ImGuiDockNode *)(g->IO).IniFilename);
      }
      bVar8 = ImGuiDockNode::IsRootNode((ImGuiDockNode *)g);
      if (bVar8) {
        RenderWindowOuterBorders(_window_n);
      }
    }
    if ((window._7_1_ & 1) != 0) {
      End();
    }
  }
  else {
    if (*(int *)&(g->IO).LogFilename == 1) {
      ppIVar10 = ImVector<ImGuiWindow_*>::operator[]
                           ((ImVector<ImGuiWindow_*> *)&(g->IO).LogFilename,0);
      ref_window = *ppIVar10;
      *(ImVec2 *)((g->IO).KeyMap + 1) = ref_window->Pos;
      *(ImVec2 *)((g->IO).KeyMap + 3) = ref_window->SizeFull;
      *(ushort *)&(g->IO).FontDefault = *(ushort *)&(g->IO).FontDefault & 0xfe3f | 0x80;
      *(ushort *)&(g->IO).FontDefault = *(ushort *)&(g->IO).FontDefault & 0xffc7 | 0x10;
      *(ushort *)&(g->IO).FontDefault = *(ushort *)&(g->IO).FontDefault & 0xfff8 | 2;
      if ((*(long *)((g->IO).KeyMap + 0x11) != 0) &&
         (pIStack_18->NavWindow == *(ImGuiWindow **)((g->IO).KeyMap + 0x11))) {
        FocusWindow(ref_window);
      }
      if (*(long *)((g->IO).KeyMap + 0x11) != 0) {
        ref_window->Viewport = *(ImGuiViewportP **)(*(long *)((g->IO).KeyMap + 0x11) + 0x30);
        ref_window->ViewportId = *(ImGuiID *)(*(long *)((g->IO).KeyMap + 0x11) + 0x38);
        if ((*(byte *)(*(long *)((g->IO).KeyMap + 0x11) + 0xbe) & 1) != 0) {
          ref_window->Viewport->Window = ref_window;
          ref_window->ViewportOwned = true;
        }
      }
    }
    DockNodeHideHostWindow((ImGuiDockNode *)g);
    node_00 = g;
    (g->IO).KeyMap[0xf] = 1;
    *(ushort *)&(g->IO).FontDefault = *(ushort *)&(g->IO).FontDefault & 0xbfff;
    *(undefined4 *)&(g->IO).FontAllowUserScaling = 0;
    *(ushort *)&(g->IO).FontDefault = *(ushort *)&(g->IO).FontDefault & 0xdfff;
    *(ushort *)&(g->IO).FontDefault = *(ushort *)&(g->IO).FontDefault & 0xefff;
    *(ushort *)&(g->IO).FontDefault = *(ushort *)&(g->IO).FontDefault & 0xf7ff;
    *(int *)((long)&(g->IO).UserData + 4) = pIStack_18->FrameCount;
    if ((((ulong)(g->IO).FontDefault & 0x10000) != 0) && (*(int *)&(g->IO).LogFilename == 1)) {
      ppIVar10 = ImVector<ImGuiWindow_*>::operator[]
                           ((ImVector<ImGuiWindow_*> *)&(g->IO).LogFilename,0);
      DockNodeStartMouseMovingWindow((ImGuiDockNode *)node_00,*ppIVar10);
    }
  }
  return;
}

Assistant:

static void ImGui::DockNodeUpdate(ImGuiDockNode* node)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(node->LastFrameActive != g.FrameCount);
    node->LastFrameAlive = g.FrameCount;
    node->MarkedForPosSizeWrite = false;

    node->CentralNode = node->OnlyNodeWithWindows = NULL;
    if (node->IsRootNode())
        DockNodeUpdateForRootNode(node);

    // Remove tab bar if not needed
    if (node->TabBar && node->IsNoTabBar())
        DockNodeRemoveTabBar(node);

    // Early out for hidden root dock nodes (when all DockId references are in inactive windows, or there is only 1 floating window holding on the DockId)
    bool want_to_hide_host_window = false;
    if (node->Windows.Size <= 1 && node->IsFloatingNode() && node->IsLeafNode())
        if (!g.IO.ConfigDockingAlwaysTabBar && (node->Windows.Size == 0 || !node->Windows[0]->WindowClass.DockingAlwaysTabBar))
            want_to_hide_host_window = true;
    if (want_to_hide_host_window)
    {
        if (node->Windows.Size == 1)
        {
            // Floating window pos/size is authoritative
            ImGuiWindow* single_window = node->Windows[0];
            node->Pos = single_window->Pos;
            node->Size = single_window->SizeFull;
            node->AuthorityForPos = node->AuthorityForSize = node->AuthorityForViewport = ImGuiDataAuthority_Window;

            // Transfer focus immediately so when we revert to a regular window it is immediately selected
            if (node->HostWindow && g.NavWindow == node->HostWindow)
                FocusWindow(single_window);
            if (node->HostWindow)
            {
                single_window->Viewport = node->HostWindow->Viewport;
                single_window->ViewportId = node->HostWindow->ViewportId;
                if (node->HostWindow->ViewportOwned)
                {
                    single_window->Viewport->Window = single_window;
                    single_window->ViewportOwned = true;
                }
            }
        }

        DockNodeHideHostWindow(node);
        node->State = ImGuiDockNodeState_HostWindowHiddenBecauseSingleWindow;
        node->WantCloseAll = false;
        node->WantCloseTabId = 0;
        node->HasCloseButton = node->HasWindowMenuButton = node->EnableCloseButton = false;
        node->LastFrameActive = g.FrameCount;

        if (node->WantMouseMove && node->Windows.Size == 1)
            DockNodeStartMouseMovingWindow(node, node->Windows[0]);
        return;
    }

    // In some circumstance we will defer creating the host window (so everything will be kept hidden),
    // while the expected visible window is resizing itself.
    // This is important for first-time (no ini settings restored) single window when io.ConfigDockingAlwaysTabBar is enabled,
    // otherwise the node ends up using the minimum window size. Effectively those windows will take an extra frame to show up:
    //   N+0: Begin(): window created (with no known size), node is created
    //   N+1: DockNodeUpdate(): node skip creating host window / Begin(): window size applied, not visible
    //   N+2: DockNodeUpdate(): node can create host window / Begin(): window becomes visible
    // We could remove this frame if we could reliably calculate the expected window size during node update, before the Begin() code.
    // It would require a generalization of CalcWindowExpectedSize(), probably extracting code away from Begin().
    // In reality it isn't very important as user quickly ends up with size data in .ini file.
    if (node->IsVisible && node->HostWindow == NULL && node->IsFloatingNode() && node->IsLeafNode())
    {
        IM_ASSERT(node->Windows.Size > 0);
        ImGuiWindow* ref_window = NULL;
        if (node->SelectedTabId != 0) // Note that we prune single-window-node settings on .ini loading, so this is generally 0 for them!
            ref_window = DockNodeFindWindowByID(node, node->SelectedTabId);
        if (ref_window == NULL)
            ref_window = node->Windows[0];
        if (ref_window->AutoFitFramesX > 0 || ref_window->AutoFitFramesY > 0)
        {
            node->State = ImGuiDockNodeState_HostWindowHiddenBecauseWindowsAreResizing;
            return;
        }
    }

    const ImGuiDockNodeFlags node_flags = node->GetMergedFlags();

    // Bind or create host window
    ImGuiWindow* host_window = NULL;
    bool beginned_into_host_window = false;
    if (node->IsDockSpace())
    {
        // [Explicit root dockspace node]
        IM_ASSERT(node->HostWindow);
        node->EnableCloseButton = false;
        node->HasCloseButton = (node_flags & ImGuiDockNodeFlags_NoCloseButton) == 0;
        node->HasWindowMenuButton = (node_flags & ImGuiDockNodeFlags_NoWindowMenuButton) == 0;
        host_window = node->HostWindow;
    }
    else
    {
        // [Automatic root or child nodes]
        node->EnableCloseButton = false;
        node->HasCloseButton = (node->Windows.Size > 0) && (node_flags & ImGuiDockNodeFlags_NoCloseButton) == 0;
        node->HasWindowMenuButton = (node->Windows.Size > 0) && (node_flags & ImGuiDockNodeFlags_NoWindowMenuButton) == 0;
        for (int window_n = 0; window_n < node->Windows.Size; window_n++)
        {
            // FIXME-DOCK: Setting DockIsActive here means that for single active window in a leaf node, DockIsActive will be cleared until the next Begin() call.
            ImGuiWindow* window = node->Windows[window_n];
            window->DockIsActive = (node->Windows.Size > 1);
            node->EnableCloseButton |= window->HasCloseButton;
        }

        if (node->IsRootNode() && node->IsVisible)
        {
            ImGuiWindow* ref_window = (node->Windows.Size > 0) ? node->Windows[0] : NULL;

            // Sync Pos
            if (node->AuthorityForPos == ImGuiDataAuthority_Window && ref_window)
                SetNextWindowPos(ref_window->Pos);
            else if (node->AuthorityForPos == ImGuiDataAuthority_DockNode)
                SetNextWindowPos(node->Pos);

            // Sync Size
            if (node->AuthorityForSize == ImGuiDataAuthority_Window && ref_window)
                SetNextWindowSize(ref_window->SizeFull);
            else if (node->AuthorityForSize == ImGuiDataAuthority_DockNode)
                SetNextWindowSize(node->Size);

            // Sync Collapsed
            if (node->AuthorityForSize == ImGuiDataAuthority_Window && ref_window)
                SetNextWindowCollapsed(ref_window->Collapsed);

            // Sync Viewport
            if (node->AuthorityForViewport == ImGuiDataAuthority_Window && ref_window)
                SetNextWindowViewport(ref_window->ViewportId);

            SetNextWindowClass(&node->WindowClass);

            // Begin into the host window
            char window_label[20];
            DockNodeGetHostWindowTitle(node, window_label, IM_ARRAYSIZE(window_label));
            ImGuiWindowFlags window_flags = ImGuiWindowFlags_NoScrollbar | ImGuiWindowFlags_NoScrollWithMouse | ImGuiWindowFlags_DockNodeHost;
            window_flags |= ImGuiWindowFlags_NoFocusOnAppearing;
            window_flags |= ImGuiWindowFlags_NoSavedSettings | ImGuiWindowFlags_NoNavFocus | ImGuiWindowFlags_NoCollapse;
            window_flags |= ImGuiWindowFlags_NoTitleBar;

            PushStyleVar(ImGuiStyleVar_WindowPadding, ImVec2(0, 0));
            Begin(window_label, NULL, window_flags);
            PopStyleVar();
            beginned_into_host_window = true;

            node->HostWindow = host_window = g.CurrentWindow;
            host_window->DockNodeAsHost = node;
            host_window->DC.CursorPos = host_window->Pos;
            node->Pos = host_window->Pos;
            node->Size = host_window->Size;

            // We set ImGuiWindowFlags_NoFocusOnAppearing because we don't want the host window to take full focus (e.g. steal NavWindow)
            // But we still it bring it to the front of display. There's no way to choose this precise behavior via window flags.
            // One simple case to ponder if: window A has a toggle to create windows B/C/D. Dock B/C/D together, clear the toggle and enable it again.
            // When reappearing B/C/D will request focus and be moved to the top of the display pile, but they are not linked to the dock host window
            // during the frame they appear. The dock host window would keep its old display order, and the sorting in EndFrame would move B/C/D back
            // after the dock host window, losing their top-most status.
            if (node->HostWindow->Appearing)
                BringWindowToDisplayFront(node->HostWindow);

            node->AuthorityForPos = node->AuthorityForSize = node->AuthorityForViewport = ImGuiDataAuthority_Auto;
        }
        else if (node->ParentNode)
        {
            node->HostWindow = host_window = node->ParentNode->HostWindow;
            node->AuthorityForPos = node->AuthorityForSize = node->AuthorityForViewport = ImGuiDataAuthority_Auto;
        }
        if (node->WantMouseMove && node->HostWindow)
            DockNodeStartMouseMovingWindow(node, node->HostWindow);
    }

    // Update focused node (the one whose title bar is highlight) within a node tree
    if (node->IsSplitNode())
        IM_ASSERT(node->TabBar == NULL);
    if (node->IsRootNode())
        if (g.NavWindow && g.NavWindow->RootWindowDockStop->DockNode && g.NavWindow->RootWindowDockStop->ParentWindow == host_window)
            node->LastFocusedNodeId = g.NavWindow->RootWindowDockStop->DockNode->ID;

    // We need to draw a background at the root level if requested by ImGuiDockNodeFlags_PassthruCentralNode, but we will only know the correct pos/size after
    // processing the resizing splitters. So we are using the DrawList channel splitting facility to submit drawing primitives out of order!
    const bool render_dockspace_bg = node->IsRootNode() && host_window && (node_flags & ImGuiDockNodeFlags_PassthruCentralNode) != 0;
    if (render_dockspace_bg)
    {
        host_window->DrawList->ChannelsSplit(2);
        host_window->DrawList->ChannelsSetCurrent(1);
    }

    // Register a hit-test hole in the window unless we are currently dragging a window that is compatible with our dockspace
    const ImGuiDockNode* central_node = node->CentralNode;
    const bool central_node_hole = node->IsRootNode() && host_window && (node_flags & ImGuiDockNodeFlags_PassthruCentralNode) != 0 && central_node != NULL && central_node->IsEmpty();
    bool central_node_hole_register_hit_test_hole = central_node_hole;
    if (central_node_hole)
        if (const ImGuiPayload* payload = ImGui::GetDragDropPayload())
            if (payload->IsDataType(IMGUI_PAYLOAD_TYPE_WINDOW) && DockNodeIsDropAllowed(host_window, *(ImGuiWindow**)payload->Data))
                central_node_hole_register_hit_test_hole = false;
    if (central_node_hole_register_hit_test_hole)
    {
        // Add a little padding to match the "resize from edges" behavior and allow grabbing the splitter easily.
        IM_ASSERT(node->IsDockSpace()); // We cannot pass this flag without the DockSpace() api. Testing this because we also setup the hole in host_window->ParentNode
        ImRect central_hole(central_node->Pos, central_node->Pos + central_node->Size);
        central_hole.Expand(ImVec2(-WINDOWS_RESIZE_FROM_EDGES_HALF_THICKNESS, -WINDOWS_RESIZE_FROM_EDGES_HALF_THICKNESS));
        if (central_node_hole && !central_hole.IsInverted())
        {
            SetWindowHitTestHole(host_window, central_hole.Min, central_hole.Max - central_hole.Min);
            SetWindowHitTestHole(host_window->ParentWindow, central_hole.Min, central_hole.Max - central_hole.Min);
        }
    }

    // Update position/size, process and draw resizing splitters
    if (node->IsRootNode() && host_window)
    {
        DockNodeTreeUpdatePosSize(node, host_window->Pos, host_window->Size);
        DockNodeTreeUpdateSplitter(node);
    }

    // Draw empty node background (currently can only be the Central Node)
    if (host_window && node->IsEmpty() && node->IsVisible && !(node_flags & ImGuiDockNodeFlags_PassthruCentralNode))
        host_window->DrawList->AddRectFilled(node->Pos, node->Pos + node->Size, GetColorU32(ImGuiCol_DockingEmptyBg));

    // Draw whole dockspace background if ImGuiDockNodeFlags_PassthruCentralNode if set.
    if (render_dockspace_bg && node->IsVisible)
    {
        host_window->DrawList->ChannelsSetCurrent(0);
        if (central_node_hole)
            RenderRectFilledWithHole(host_window->DrawList, node->Rect(), central_node->Rect(), GetColorU32(ImGuiCol_WindowBg), 0.0f);
        else
            host_window->DrawList->AddRectFilled(node->Pos, node->Pos + node->Size, GetColorU32(ImGuiCol_WindowBg), 0.0f);
        host_window->DrawList->ChannelsMerge();
    }

    // Draw and populate Tab Bar
    if (host_window && node->Windows.Size > 0)
    {
        DockNodeUpdateTabBar(node, host_window);
    }
    else
    {
        node->WantCloseAll = false;
        node->WantCloseTabId = 0;
        node->IsFocused = false;
    }
    if (node->TabBar && node->TabBar->SelectedTabId)
        node->SelectedTabId = node->TabBar->SelectedTabId;
    else if (node->Windows.Size > 0)
        node->SelectedTabId = node->Windows[0]->ID;

    // Draw payload drop target
    if (host_window && node->IsVisible)
        if (node->IsRootNode() && (g.MovingWindow == NULL || g.MovingWindow->RootWindow != host_window))
            BeginDockableDragDropTarget(host_window);

    // We update this after DockNodeUpdateTabBar()
    node->LastFrameActive = g.FrameCount;

    // Recurse into children
    // FIXME-DOCK FIXME-OPT: Should not need to recurse into children
    if (host_window)
    {
        if (node->ChildNodes[0])
            DockNodeUpdate(node->ChildNodes[0]);
        if (node->ChildNodes[1])
            DockNodeUpdate(node->ChildNodes[1]);

        // Render outer borders last (after the tab bar)
        if (node->IsRootNode())
            RenderWindowOuterBorders(host_window);
    }

    // End host window
    if (beginned_into_host_window) //-V1020
        End();
}